

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall QtMWidgets::MessageBox::removeButton(MessageBox *this,QAbstractButton *button)

{
  MessageBoxPrivate *pMVar1;
  QHBoxLayout *pQVar2;
  bool bVar3;
  qsizetype qVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  QAbstractButton *local_30;
  undefined8 local_28;
  
  pMVar1 = (this->d).d;
  if (pMVar1->okButton != (MsgBoxButton *)button) {
    local_30 = button;
    bVar3 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                      (&pMVar1->buttonsMap,&local_30);
    if (bVar3) {
      qVar4 = QtPrivate::indexOf<QAbstractButton*,QAbstractButton*>
                        (&((this->d).d)->buttons,&local_30,0);
      iVar8 = (int)qVar4;
      if (iVar8 != -1) {
        pQVar2 = ((this->d).d)->hbox;
        plVar5 = (long *)(**(code **)(*(long *)pQVar2 + 0xb0))(pQVar2,iVar8 * 2);
        pQVar2 = ((this->d).d)->hbox;
        plVar6 = (long *)(**(code **)(*(long *)pQVar2 + 0xb0))(pQVar2,iVar8 * 2 + -1);
        lVar7 = (**(code **)(*plVar6 + 0x68))(plVar6);
        if (lVar7 != 0) {
          (**(code **)(*plVar6 + 0x68))(plVar6);
          QObject::deleteLater();
        }
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 8))(plVar5);
        }
        (**(code **)(*plVar6 + 8))(plVar6);
        QList<QAbstractButton_*>::removeAt(&((this->d).d)->buttons,(long)iVar8);
        QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::remove
                  (&((this->d).d)->buttonsMap,(char *)&local_30);
        QList<QFrame_*>::removeAt(&((this->d).d)->buttonSeparators,(long)(iVar8 + -1));
        QObject::disconnect((QObject *)local_30,(char *)0x0,(QObject *)this,(char *)0x0);
        QObject::deleteLater();
        local_28 = (**(code **)(*(long *)((this->d).d)->vbox + 0xf0))();
        QWidget::resize((QSize *)this);
        MessageBoxPrivate::adjustSize((this->d).d);
      }
    }
  }
  return;
}

Assistant:

void
MessageBox::removeButton( QAbstractButton * button )
{
	if( d->okButton != button && d->buttonsMap.contains( button ) )
	{
		const int index = d->buttons.indexOf( button );

		if( index != -1 )
		{
			QLayoutItem * b = d->hbox->takeAt( index * 2 );
			QLayoutItem * l = d->hbox->takeAt( index * 2 - 1 );

			if( l->widget() )
				l->widget()->deleteLater();

			delete b;
			delete l;

			d->buttons.removeAt( index );
			d->buttonsMap.remove( button );
			d->buttonSeparators.removeAt( index - 1 );

			disconnect( button, 0, this, 0 );

			button->deleteLater();

			resize( d->vbox->sizeHint() );

			d->adjustSize();
		}
	}
}